

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

bool __thiscall
JsUtil::
BaseHashSet<JsUtil::CharacterBuffer<char16_t>,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_JsUtil::CharacterBuffer<char16_t>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
::Contains(BaseHashSet<JsUtil::CharacterBuffer<char16_t>,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_JsUtil::CharacterBuffer<char16_t>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
           *this,CharacterBuffer<char16_t> *element)

{
  char16_t *pcVar1;
  int iVar2;
  CharacterBuffer<char16_t> local_38;
  
  pcVar1 = (element->string).ptr;
  Memory::Recycler::WBSetBit((char *)&local_38);
  local_38.string.ptr = pcVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_38);
  local_38.len = element->len;
  iVar2 = BaseDictionary<JsUtil::CharacterBuffer<char16_t>,JsUtil::CharacterBuffer<char16_t>,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
          ::FindEntryWithKey<JsUtil::CharacterBuffer<char16_t>>
                    ((BaseDictionary<JsUtil::CharacterBuffer<char16_t>,JsUtil::CharacterBuffer<char16_t>,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
                      *)this,&local_38);
  return -1 < iVar2;
}

Assistant:

bool Contains(TElement const& element) const
        {
            return ContainsKey(ValueToKey<TKey, TElement>::ToKey(element));
        }